

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::CopyPchCompilePdb
          (cmLocalGenerator *this,string *config,cmGeneratorTarget *target,string *ReuseFrom,
          cmGeneratorTarget *reuseTarget,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmTarget *this_00;
  __single_object _Var2;
  int iVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  ostream *poVar6;
  cmSourceFile *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  string_view expr;
  string_view expr_00;
  string_view expr_01;
  string_view expr_02;
  string_view expr_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string to_dir;
  __single_object cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  anon_class_16_2_381a533d configGenex;
  undefined1 local_450 [32];
  size_type local_430;
  pointer local_428;
  size_type local_420;
  pointer local_418;
  string *local_410;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_408;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_400;
  string from_file;
  string target_compile_pdb_dir;
  string pdb_prefix;
  string dest_file;
  string local_358;
  string copy_script;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_2e8;
  cmCustomCommandLines commandLines;
  string local_2b8;
  cmGeneratedFileStream file;
  
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  local_410 = config;
  if ((char)iVar3 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pdb_prefix,"",(allocator<char> *)&file);
  }
  else {
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (config->_M_dataplus)._M_p;
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)config->_M_string_length;
    local_450._0_8_ = (pointer)0x1;
    local_450._8_8_ = "/";
    cmStrCat<>(&pdb_prefix,(cmAlphaNum *)&file,(cmAlphaNum *)local_450);
  }
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar5->_M_dataplus)._M_p;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)psVar5->_M_string_length;
  local_450._0_8_ = (pointer)0x1;
  local_450._8_8_ = "/";
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmStrCat<std::__cxx11::string,char[6]>
            (&target_compile_pdb_dir,(cmAlphaNum *)&file,(cmAlphaNum *)local_450,psVar5,
             (char (*) [6])0x5f06d3);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)target_compile_pdb_dir._M_string_length;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       target_compile_pdb_dir._M_dataplus._M_p;
  local_450._0_8_ = (pointer)0xd;
  local_450._8_8_ = "copy_idb_pdb_";
  cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
       (local_410->_M_dataplus)._M_p;
  cmStrCat<char_const*,char[7]>
            (&copy_script,(cmAlphaNum *)&file,(cmAlphaNum *)local_450,(char **)&cc,
             (char (*) [7])0x5ca81b);
  cmGeneratedFileStream::cmGeneratedFileStream(&file,&copy_script,false,None);
  std::operator<<((ostream *)&file,"# CMake generated file\n");
  poVar6 = std::operator<<((ostream *)&file,
                           "# The compiler generated pdb file needs to be written to disk\n");
  poVar6 = std::operator<<(poVar6,"# by mspdbsrv. The foreach retry loop is needed to make sure\n");
  std::operator<<(poVar6,"# the pdb file is ready to be copied.\n\n");
  pbVar1 = (extensions->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (args_3 = (extensions->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; args_3 != pbVar1; args_3 = args_3 + 1) {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(reuseTarget);
    psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    local_450._8_8_ = (psVar5->_M_dataplus)._M_p;
    local_450._0_8_ = psVar5->_M_string_length;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x1;
    cmStrCat<std::__cxx11::string,char[19],std::__cxx11::string,std::__cxx11::string>
              (&from_file,(cmAlphaNum *)local_450,(cmAlphaNum *)&cc,ReuseFrom,
               (char (*) [19])".dir/${PDB_PREFIX}",ReuseFrom,args_3);
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    local_450._8_8_ = (psVar5->_M_dataplus)._M_p;
    local_450._0_8_ = psVar5->_M_string_length;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x1;
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    cmStrCat<std::__cxx11::string,char[19]>
              (&to_dir,(cmAlphaNum *)local_450,(cmAlphaNum *)&cc,psVar5,
               (char (*) [19])".dir/${PDB_PREFIX}");
    local_450._0_8_ = to_dir._M_string_length;
    local_450._8_8_ = to_dir._M_dataplus._M_p;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         ReuseFrom->_M_string_length;
    cmStrCat<std::__cxx11::string>
              ((string *)&outputs,(cmAlphaNum *)local_450,(cmAlphaNum *)&cc,args_3);
    std::__cxx11::string::string((string *)&dest_file,(string *)&outputs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_450,"PREFIX",(allocator<char> *)&cc);
    psVar5 = cmGeneratorTarget::GetSafeProperty(target,(string *)local_450);
    std::__cxx11::string::~string((string *)local_450);
    if (psVar5->_M_string_length != 0) {
      local_450._0_8_ = to_dir._M_string_length;
      local_450._8_8_ = to_dir._M_dataplus._M_p;
      cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           psVar5->_M_string_length;
      cmStrCat<std::__cxx11::string,std::__cxx11::string>
                (&local_358,(cmAlphaNum *)local_450,(cmAlphaNum *)&cc,ReuseFrom,args_3);
      std::__cxx11::string::operator=((string *)&dest_file,(string *)&local_358);
      std::__cxx11::string::~string((string *)&local_358);
    }
    std::operator<<((ostream *)&file,"foreach(retry RANGE 1 30)\n");
    poVar6 = std::operator<<((ostream *)&file,"  if (EXISTS \"");
    poVar6 = std::operator<<(poVar6,(string *)&from_file);
    poVar6 = std::operator<<(poVar6,"\" AND (NOT EXISTS \"");
    poVar6 = std::operator<<(poVar6,(string *)&dest_file);
    poVar6 = std::operator<<(poVar6,"\" OR NOT \"");
    poVar6 = std::operator<<(poVar6,(string *)&dest_file);
    poVar6 = std::operator<<(poVar6,"  \" IS_NEWER_THAN \"");
    poVar6 = std::operator<<(poVar6,(string *)&from_file);
    std::operator<<(poVar6,"\"))\n");
    std::operator<<((ostream *)&file,"    execute_process(COMMAND ${CMAKE_COMMAND} -E copy");
    poVar6 = std::operator<<((ostream *)&file," \"");
    poVar6 = std::operator<<(poVar6,(string *)&from_file);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," \"");
    poVar6 = std::operator<<(poVar6,(string *)&to_dir);
    poVar6 = std::operator<<(poVar6,"\" RESULT_VARIABLE result ");
    std::operator<<(poVar6," ERROR_QUIET)\n");
    poVar6 = std::operator<<((ostream *)&file,"    if (NOT result EQUAL 0)\n");
    poVar6 = std::operator<<(poVar6,"      execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar6 = std::operator<<(poVar6," -E sleep 1)\n");
    std::operator<<(poVar6,"    else()\n");
    if (psVar5->_M_string_length != 0) {
      poVar6 = std::operator<<((ostream *)&file,"  file(REMOVE \"");
      poVar6 = std::operator<<(poVar6,(string *)&dest_file);
      std::operator<<(poVar6,"\")\n");
      poVar6 = std::operator<<((ostream *)&file,"  file(RENAME \"");
      poVar6 = std::operator<<(poVar6,(string *)&outputs);
      poVar6 = std::operator<<(poVar6,"\" \"");
      poVar6 = std::operator<<(poVar6,(string *)&dest_file);
      std::operator<<(poVar6,"\")\n");
    }
    poVar6 = std::operator<<((ostream *)&file,"      break()\n");
    std::operator<<(poVar6,"    endif()\n");
    poVar6 = std::operator<<((ostream *)&file,"  elseif(NOT EXISTS \"");
    poVar6 = std::operator<<(poVar6,(string *)&from_file);
    poVar6 = std::operator<<(poVar6,"\")\n");
    poVar6 = std::operator<<(poVar6,"    execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar6 = std::operator<<(poVar6," -E sleep 1)\n");
    std::operator<<(poVar6,"  endif()\n");
    std::operator<<((ostream *)&file,"endforeach()\n");
    std::__cxx11::string::~string((string *)&dest_file);
    std::__cxx11::string::~string((string *)&outputs);
    std::__cxx11::string::~string((string *)&to_dir);
    std::__cxx11::string::~string((string *)&from_file);
  }
  configGenex.config = local_410;
  configGenex.this = this;
  psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  expr._M_str = (psVar5->_M_dataplus)._M_p;
  expr._M_len = psVar5->_M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const(&to_dir,&configGenex,expr);
  local_450._0_8_ = to_dir._M_string_length;
  local_450._8_8_ = to_dir._M_dataplus._M_p;
  cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
       (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0xd;
  from_file._M_dataplus._M_p = (pointer)pdb_prefix._M_string_length;
  from_file._M_string_length = (size_type)pdb_prefix._M_dataplus._M_p;
  cmStrCat<>(&dest_file,(cmAlphaNum *)&cc,(cmAlphaNum *)&from_file);
  expr_00._M_str = dest_file._M_dataplus._M_p;
  expr_00._M_len = dest_file._M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const((string *)&outputs,&configGenex,expr_00);
  local_450._16_8_ =
       outputs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_450._24_8_ =
       outputs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  expr_01._M_str = "-P";
  expr_01._M_len = 2;
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const(&local_358,&configGenex,expr_01);
  local_430 = local_358._M_string_length;
  local_428 = local_358._M_dataplus._M_p;
  expr_02._M_str = copy_script._M_dataplus._M_p;
  expr_02._M_len = copy_script._M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const(&local_2b8,&configGenex,expr_02);
  local_420 = local_2b8._M_string_length;
  local_418 = local_2b8._M_dataplus._M_p;
  ilist._M_len = 4;
  ilist._M_array = (iterator)local_450;
  cmMakeSingleCommandLine(&commandLines,ilist);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&outputs);
  std::__cxx11::string::~string((string *)&dest_file);
  std::__cxx11::string::~string((string *)&to_dir);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_450._0_8_ = target_compile_pdb_dir._M_string_length;
  local_450._8_8_ = target_compile_pdb_dir._M_dataplus._M_p;
  cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
       (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
       pdb_prefix._M_string_length;
  cmStrCat<std::__cxx11::string,char[5]>
            (&to_dir,(cmAlphaNum *)local_450,(cmAlphaNum *)&cc,ReuseFrom,(char (*) [5])".pdb");
  expr_03._M_str = to_dir._M_dataplus._M_p;
  expr_03._M_len = to_dir._M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const(&from_file,&configGenex,expr_03);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&outputs,
             &from_file);
  std::__cxx11::string::~string((string *)&from_file);
  std::__cxx11::string::~string((string *)&to_dir);
  std::make_unique<cmCustomCommand>();
  _Var2 = cc;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&local_2e8,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  cmCustomCommand::SetCommandLines
            ((cmCustomCommand *)
             _Var2._M_t.
             super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
             super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
             (cmCustomCommandLines *)&local_2e8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_2e8);
  cmCustomCommand::SetComment
            ((cmCustomCommand *)
             cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
             _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,"");
  cmCustomCommand::SetCMP0116Status
            ((cmCustomCommand *)
             cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
             _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,NEW);
  *(undefined1 *)
   ((long)cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
          .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl + 0x12d) = 1;
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  _Var2 = cc;
  if ((char)iVar3 == '\0') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_318,&outputs);
    cmCustomCommand::SetOutputs
              ((cmCustomCommand *)
               _Var2._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_318);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
    local_408._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
    this_01 = AddCustomCommandToOutput(this,&local_408,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_408)
    ;
    if (this_01 != (cmSourceFile *)0x0) {
      psVar5 = cmSourceFile::ResolveFullPath(this_01,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSource(target,psVar5,false);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_300,&outputs);
    cmCustomCommand::SetByproducts
              ((cmCustomCommand *)
               _Var2._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_300);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_300);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    local_400._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
    AddCustomCommandToTarget(this,psVar5,PRE_BUILD,&local_400,Accept);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_400)
    ;
  }
  this_00 = target->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"COMPILE_PDB_OUTPUT_DIRECTORY",(allocator<char> *)&from_file);
  cmTarget::SetProperty(this_00,(string *)local_450,&target_compile_pdb_dir);
  std::__cxx11::string::~string((string *)local_450);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  cmGeneratedFileStream::~cmGeneratedFileStream(&file);
  std::__cxx11::string::~string((string *)&copy_script);
  std::__cxx11::string::~string((string *)&target_compile_pdb_dir);
  std::__cxx11::string::~string((string *)&pdb_prefix);
  return;
}

Assistant:

void cmLocalGenerator::CopyPchCompilePdb(
  const std::string& config, cmGeneratorTarget* target,
  const std::string& ReuseFrom, cmGeneratorTarget* reuseTarget,
  const std::vector<std::string>& extensions)
{
  const std::string pdb_prefix =
    this->GetGlobalGenerator()->IsMultiConfig() ? cmStrCat(config, "/") : "";

  const std::string target_compile_pdb_dir =
    cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
             target->GetName(), ".dir/");

  const std::string copy_script = cmStrCat(
    target_compile_pdb_dir, "copy_idb_pdb_", config.c_str(), ".cmake");
  cmGeneratedFileStream file(copy_script);

  file << "# CMake generated file\n";

  file << "# The compiler generated pdb file needs to be written to disk\n"
       << "# by mspdbsrv. The foreach retry loop is needed to make sure\n"
       << "# the pdb file is ready to be copied.\n\n";

  for (auto const& extension : extensions) {
    const std::string from_file =
      cmStrCat(reuseTarget->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/", ReuseFrom, ".dir/${PDB_PREFIX}", ReuseFrom, extension);

    const std::string to_dir =
      cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
               target->GetName(), ".dir/${PDB_PREFIX}");

    const std::string to_file = cmStrCat(to_dir, ReuseFrom, extension);

    std::string dest_file = to_file;

    std::string const& prefix = target->GetSafeProperty("PREFIX");
    if (!prefix.empty()) {
      dest_file = cmStrCat(to_dir, prefix, ReuseFrom, extension);
    }

    file << "foreach(retry RANGE 1 30)\n";
    file << "  if (EXISTS \"" << from_file << "\" AND (NOT EXISTS \""
         << dest_file << "\" OR NOT \"" << dest_file << "  \" IS_NEWER_THAN \""
         << from_file << "\"))\n";
    file << "    execute_process(COMMAND ${CMAKE_COMMAND} -E copy";
    file << " \"" << from_file << "\""
         << " \"" << to_dir << "\" RESULT_VARIABLE result "
         << " ERROR_QUIET)\n";
    file << "    if (NOT result EQUAL 0)\n"
         << "      execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "    else()\n";
    if (!prefix.empty()) {
      file << "  file(REMOVE \"" << dest_file << "\")\n";
      file << "  file(RENAME \"" << to_file << "\" \"" << dest_file << "\")\n";
    }
    file << "      break()\n"
         << "    endif()\n";
    file << "  elseif(NOT EXISTS \"" << from_file << "\")\n"
         << "    execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "  endif()\n";
    file << "endforeach()\n";
  }

  auto configGenex = [&](cm::string_view expr) -> std::string {
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      return cmStrCat("$<$<CONFIG:", config, ">:", expr, ">");
    }
    return std::string(expr);
  };

  cmCustomCommandLines commandLines = cmMakeSingleCommandLine(
    { configGenex(cmSystemTools::GetCMakeCommand()),
      configGenex(cmStrCat("-DPDB_PREFIX=", pdb_prefix)), configGenex("-P"),
      configGenex(copy_script) });

  const char* no_message = "";

  std::vector<std::string> outputs;
  outputs.push_back(configGenex(
    cmStrCat(target_compile_pdb_dir, pdb_prefix, ReuseFrom, ".pdb")));

  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  cc->SetComment(no_message);
  cc->SetCMP0116Status(cmPolicies::NEW);
  cc->SetStdPipesUTF8(true);

  if (this->GetGlobalGenerator()->IsVisualStudio()) {
    cc->SetByproducts(outputs);
    this->AddCustomCommandToTarget(
      target->GetName(), cmCustomCommandType::PRE_BUILD, std::move(cc),
      cmObjectLibraryCommands::Accept);
  } else {
    cc->SetOutputs(outputs);
    cmSourceFile* copy_rule = this->AddCustomCommandToOutput(std::move(cc));

    if (copy_rule) {
      target->AddSource(copy_rule->ResolveFullPath());
    }
  }

  target->Target->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              target_compile_pdb_dir);
}